

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_array_add_fixed_dimension(coda_type_array *type,long dim)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (type == (coda_type_array *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x66b);
  }
  else if (dim < 0) {
    coda_set_error(-400,"invalid dimension size (%ld) for array type");
  }
  else {
    iVar1 = type->num_dims;
    lVar3 = (long)iVar1;
    if (lVar3 != 8) {
      type->dim[lVar3] = dim;
      type->dim_expr[lVar3] = (coda_expression *)0x0;
      type->num_dims = iVar1 + 1;
      lVar3 = type->num_elements;
      if (lVar3 == -1) {
        return 0;
      }
      if (iVar1 == 0) {
        lVar3 = 1;
      }
      type->num_elements = lVar3 * dim;
      if (coda_format_binary < type->format) {
        return 0;
      }
      if (type->base_type == (coda_type *)0x0) {
        return 0;
      }
      lVar2 = type->base_type->bit_size;
      if (lVar2 < 0) {
        return 0;
      }
      type->bit_size = lVar2 * lVar3 * dim;
      return 0;
    }
    coda_set_error(-400,"maximum number of dimensions (%d) exceeded for array type",8);
  }
  return -1;
}

Assistant:

int coda_type_array_add_fixed_dimension(coda_type_array *type, long dim)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dim < 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid dimension size (%ld) for array type", dim);
        return -1;
    }
    if (type->num_dims == CODA_MAX_NUM_DIMS)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "maximum number of dimensions (%d) exceeded for array type",
                       CODA_MAX_NUM_DIMS);
        return -1;
    }
    type->dim[type->num_dims] = dim;
    type->dim_expr[type->num_dims] = NULL;
    type->num_dims++;

    /* update num_elements */
    if (type->num_elements != -1)
    {
        if (type->num_dims == 1)
        {
            type->num_elements = dim;
        }
        else
        {
            type->num_elements *= dim;
        }

        if (type->format == coda_format_ascii || type->format == coda_format_binary)
        {
            /* update bit_size */
            if (type->base_type != NULL && type->base_type->bit_size >= 0)
            {
                type->bit_size = type->num_elements * type->base_type->bit_size;
            }
        }
    }

    return 0;
}